

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecdsa_wycheproof(void)

{
  int iVar1;
  uchar *input;
  int actual_verify;
  uchar out [32];
  uchar *pk;
  uchar *sig;
  uchar *msg;
  secp256k1_pubkey pubkey;
  secp256k1_sha256 hasher;
  secp256k1_ecdsa_signature signature;
  int t;
  undefined4 in_stack_fffffffffffffed0;
  int iVar2;
  uchar *in_stack_fffffffffffffed8;
  secp256k1_sha256 *in_stack_fffffffffffffee0;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffff10;
  secp256k1_context *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff28;
  secp256k1_pubkey *in_stack_ffffffffffffff30;
  secp256k1_context *in_stack_ffffffffffffff38;
  secp256k1_pubkey *in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffff90;
  secp256k1_context *in_stack_ffffffffffffff98;
  int local_4;
  
  local_4 = 0;
  while( true ) {
    if (0x1ce < local_4) {
      return;
    }
    memset(&stack0xfffffffffffffed8,0,0x20);
    iVar2 = 0;
    memset(&stack0xffffffffffffff10,0,0x40);
    iVar1 = secp256k1_ec_pubkey_parse
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
                       ,in_stack_ffffffffffffff20);
    if (iVar1 != 1) break;
    secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff50);
    input = "123400255854264797247138684891103593316683949401215134429307937062117123436887121351530370655320312615643466034429539117109532613515987350041346300687898173202873222041046666630710410359518981846597195313604618926637842541652100524574808169663439134681541103598104785801281053628556895390410597884803936106724421054240705517444819719675612513447253343368264318326119860896787810944958823823824637837110208337761338716483221441621068665554662155246703081877459245237441495586621400531440630964575122784025620261878741816426252626824189436484245425Msg"
            + test_ecdsa_wycheproof::testvectors[local_4].msg_offset;
    secp256k1_sha256_write
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               CONCAT44(iVar2,in_stack_fffffffffffffed0));
    secp256k1_sha256_finalize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    iVar1 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,input,
                       (size_t)("0F\x02!" + test_ecdsa_wycheproof::testvectors[local_4].sig_offset))
    ;
    if (iVar1 == 1) {
      iVar2 = secp256k1_ecdsa_verify
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    if (test_ecdsa_wycheproof::testvectors[local_4].expected_verify != iVar2) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1d01,"test condition failed: testvectors[t].expected_verify == actual_verify");
      abort();
    }
    local_4 = local_4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x1cf6,"test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkey, pk, 65) == 1");
  abort();
}

Assistant:

static void test_ecdsa_wycheproof(void) {
    #include "wycheproof/ecdsa_secp256k1_sha256_bitcoin_test.h"

    int t;
    for (t = 0; t < SECP256K1_ECDSA_WYCHEPROOF_NUMBER_TESTVECTORS; t++) {
        secp256k1_ecdsa_signature signature;
        secp256k1_sha256 hasher;
        secp256k1_pubkey pubkey;
        const unsigned char *msg, *sig, *pk;
        unsigned char out[32] = {0};
        int actual_verify = 0;

        memset(&pubkey, 0, sizeof(pubkey));
        pk = &wycheproof_ecdsa_public_keys[testvectors[t].pk_offset];
        CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pk, 65) == 1);

        secp256k1_sha256_initialize(&hasher);
        msg = &wycheproof_ecdsa_messages[testvectors[t].msg_offset];
        secp256k1_sha256_write(&hasher, msg, testvectors[t].msg_len);
        secp256k1_sha256_finalize(&hasher, out);

        sig = &wycheproof_ecdsa_signatures[testvectors[t].sig_offset];
        if (secp256k1_ecdsa_signature_parse_der(CTX, &signature, sig, testvectors[t].sig_len) == 1) {
            actual_verify = secp256k1_ecdsa_verify(CTX, (const secp256k1_ecdsa_signature *)&signature, out, &pubkey);
        }
        CHECK(testvectors[t].expected_verify == actual_verify);
    }
}